

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Linear_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Linear_Object_State_PDU::Linear_Object_State_PDU
          (Linear_Object_State_PDU *this,EntityIdentifier *ObjID,EntityIdentifier *RefObjID,
          KUINT16 UpdateNum,ForceID FI,SimulationIdentifier *ReqID,SimulationIdentifier *RecvID,
          ObjectType *O)

{
  KUINT16 KVar1;
  KUINT8 KVar2;
  KUINT8 KVar3;
  KUINT8 KVar4;
  
  Object_State_Header::Object_State_Header
            (&this->super_Object_State_Header,ObjID,RefObjID,UpdateNum,FI);
  (this->super_Object_State_Header).super_Header.super_Header6._vptr_Header6 =
       (_func_int **)&PTR__Linear_Object_State_PDU_00216328;
  (this->super_Object_State_Header).field_0x4b = 0;
  (this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216f20;
  KVar1 = ReqID->m_ui16ApplicationID;
  (this->m_ReqID).m_ui16SiteID = ReqID->m_ui16SiteID;
  (this->m_ReqID).m_ui16ApplicationID = KVar1;
  (this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SimulationIdentifier_00216f20;
  KVar1 = RecvID->m_ui16ApplicationID;
  (this->m_RecvID).m_ui16SiteID = RecvID->m_ui16SiteID;
  (this->m_RecvID).m_ui16ApplicationID = KVar1;
  (this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__ObjectType_002183d8;
  KVar2 = O->m_ui8EntityKind;
  KVar3 = O->m_ui8Category;
  KVar4 = O->m_ui8SubCategory;
  (this->m_ObjTyp).m_ui8Domain = O->m_ui8Domain;
  (this->m_ObjTyp).m_ui8EntityKind = KVar2;
  (this->m_ObjTyp).m_ui8Category = KVar3;
  (this->m_ObjTyp).m_ui8SubCategory = KVar4;
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vSegments).
  super__Vector_base<KDIS::DATA_TYPE::LinearSegmentParameter,_std::allocator<KDIS::DATA_TYPE::LinearSegmentParameter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui8PDUType = ',';
  (this->super_Object_State_Header).super_Header.super_Header6.m_ui16PDULength = 0x28;
  return;
}

Assistant:

Linear_Object_State_PDU::Linear_Object_State_PDU( const EntityIdentifier & ObjID, const EntityIdentifier & RefObjID , KUINT16 UpdateNum,
        ForceID FI, const SimulationIdentifier & ReqID, const SimulationIdentifier & RecvID,
        const ObjectType & O ) :
    Object_State_Header( ObjID, RefObjID, UpdateNum, FI ),
    m_ReqID( ReqID ),
    m_RecvID( RecvID ),
    m_ObjTyp( O ),
    m_ui8NumSegment( 0 )
{
    m_ui8PDUType = LinearObjectState_PDU_Type;
    m_ui16PDULength = LINEAR_OBJECT_STATE_PDU_SIZE;
}